

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O1

void __thiscall test_b_tree::test_concurrent_inserts(test_b_tree *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *pvVar2;
  pointer ptVar3;
  pointer ptVar4;
  pointer pvVar5;
  ulong uVar6;
  runtime_error *this_00;
  allocator_type *paVar7;
  anon_class_24_3_2dc9430b_for__M_head_impl *extraout_RDX;
  anon_class_24_3_2dc9430b_for__M_head_impl *paVar8;
  thread *thread;
  ulong __n;
  allocator_type *paVar9;
  pointer *ppvVar10;
  ulong uVar11;
  allocator_type *paVar12;
  vector<long,_std::allocator<long>_> *__range1;
  bool bVar13;
  optional<long> oVar14;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  thread_keys;
  b_tree t;
  string local_d8;
  vector<std::thread,_std::allocator<std::thread>_> local_b8;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_98;
  b_tree local_80;
  
  paVar1 = &local_80._p._fileName.field_2;
  local_80._p._fileName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"test_concurrent_inserts.db","");
  b_tree::create_db_file((string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._p._fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._p._fileName._M_dataplus._M_p,
                    local_80._p._fileName.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"test_concurrent_inserts.db","");
  b_tree::b_tree(&local_80,&local_d8,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  ptVar4 = local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar3 = local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_d8._M_string_length = (size_type)&local_98;
  paVar8 = (anon_class_24_3_2dc9430b_for__M_head_impl *)
           local_98.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  *(undefined8 *)
   local_98.
   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start = 0;
  ((anon_class_24_3_2dc9430b_for__M_head_impl *)
  local_98.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start)->thread_keys =
       (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        *)0x0;
  ((anon_class_24_3_2dc9430b_for__M_head_impl *)
  local_98.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start)->t = (b_tree *)0x0;
  local_d8._M_dataplus._M_p = local_d8._M_dataplus._M_p & 0xffffffff00000000;
  local_d8.field_2._M_allocated_capacity = (size_type)&local_80;
  local_98.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar8;
  local_98.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar8;
  if (local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    if ((long)local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar11 = (long)local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar6 = uVar11 + (uVar11 == 0);
    __n = uVar6 + uVar11;
    if (0xffffffffffffffe < __n) {
      __n = 0xfffffffffffffff;
    }
    if (CARRY8(uVar6,uVar11)) {
      __n = 0xfffffffffffffff;
    }
    if (__n == 0) {
      paVar9 = (allocator_type *)0x0;
    }
    else {
      paVar9 = (allocator_type *)
               __gnu_cxx::new_allocator<std::thread>::allocate
                         ((new_allocator<std::thread> *)&local_b8,__n,(void *)0x0);
      paVar8 = extraout_RDX;
    }
    std::allocator_traits<std::allocator<std::thread>>::
    construct<std::thread,test_b_tree::test_concurrent_inserts()::__0>
              (paVar9 + uVar11 * 8,(thread *)&local_d8,paVar8);
    paVar12 = paVar9;
    for (paVar7 = (allocator_type *)ptVar3; paVar7 != (allocator_type *)ptVar4; paVar7 = paVar7 + 8)
    {
      *(id *)paVar12 = (id)0x0;
      *(native_handle_type *)paVar12 = (native_handle_type)*(id *)paVar7;
      *(id *)paVar7 = (id)0x0;
      paVar12 = paVar12 + 8;
    }
    if ((allocator_type *)ptVar3 != (allocator_type *)0x0) {
      operator_delete(ptVar3,(long)local_b8.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar3)
      ;
    }
    local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(paVar9 + __n * 8);
    local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)paVar9;
  }
  else {
    std::allocator_traits<std::allocator<std::thread>>::
    construct<std::thread,test_b_tree::test_concurrent_inserts()::__0>
              ((allocator_type *)
               local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish,(thread *)&local_d8,paVar8);
    paVar12 = (allocator_type *)
              local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(paVar12 + 8);
  ptVar3 = local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar9 = (allocator_type *)
                local_b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar5 = local_98.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, paVar9 != (allocator_type *)ptVar3;
      paVar9 = paVar9 + 8) {
    std::thread::join();
  }
  if (local_98.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar8 = (anon_class_24_3_2dc9430b_for__M_head_impl *)
             local_98.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ppvVar10 = *(pointer **)paVar8;
      pvVar2 = paVar8->thread_keys;
      while ((bVar13 = (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        *)ppvVar10 != pvVar2, bVar13 &&
             (oVar14 = b_tree::search(&local_80,(int64_t)*ppvVar10),
             ((undefined1  [16])
              oVar14.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0))
            ) {
        ppvVar10 = ppvVar10 + 1;
      }
      if (bVar13) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        rtf_format_abi_cxx11_
                  (&local_d8,"%s at Line:%d File:%s","has_all_keys(t, keys)",0xff,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                  );
        std::runtime_error::runtime_error(this_00,(string *)&local_d8);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar8 = paVar8 + 1;
    } while (paVar8 != (anon_class_24_3_2dc9430b_for__M_head_impl *)pvVar5);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"big_dotfile.txt","");
  b_tree::write_dot_file(&local_80,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
  unlink("test_concurrent_inserts.db");
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_98);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_b8);
  pager::~pager(&local_80._p);
  return;
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}